

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

ssize_t __thiscall
JSON::JSON_dictionary::write(JSON_dictionary *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  reference key;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>
  *iter;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
  *__range1;
  void *pvStack_20;
  bool first;
  size_t depth_local;
  Pipeline *p_local;
  JSON_dictionary *this_local;
  
  depth_local = CONCAT44(in_register_00000034,__fd);
  __range1._7_1_ = 1;
  pvStack_20 = __buf;
  p_local = (Pipeline *)this;
  writeDictionaryOpen((Pipeline *)depth_local,(bool *)((long)&__range1 + 7),(size_t)__buf);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
           ::begin(&this->members);
  iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
            ::end(&this->members);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&iter);
    if (!bVar1) break;
    key = std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>
          ::operator*(&__end1);
    writeDictionaryItem((Pipeline *)depth_local,(bool *)((long)&__range1 + 7),&key->first,
                        &key->second,(long)pvStack_20 + 1);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>
    ::operator++(&__end1);
  }
  writeDictionaryClose((Pipeline *)depth_local,(bool)(__range1._7_1_ & 1),(size_t)pvStack_20);
  return extraout_RAX;
}

Assistant:

void
JSON::JSON_dictionary::write(Pipeline* p, size_t depth) const
{
    bool first = true;
    writeDictionaryOpen(p, first, depth);
    for (auto const& iter: members) {
        writeDictionaryItem(p, first, iter.first, iter.second, 1 + depth);
    }
    writeDictionaryClose(p, first, depth);
}